

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshUtilities.cpp
# Opt level: O1

void Rml::MeshUtilities::GenerateQuad
               (Mesh *mesh,Vector2f origin,Vector2f dimensions,ColourbPremultiplied colour,
               Vector2f top_left_texcoord,Vector2f bottom_right_texcoord)

{
  pointer piVar1;
  pointer piVar2;
  pointer pVVar3;
  pointer piVar4;
  Vector2f VVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  piVar1 = (mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar10 = ((long)(mesh->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(mesh->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
  piVar2 = (mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::resize(&mesh->vertices,lVar10 + 4);
  ::std::vector<int,_std::allocator<int>_>::resize
            (&mesh->indices,
             ((long)(mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) + 6);
  pVVar3 = (mesh->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar9 = (int)lVar10;
  local_68 = origin.x;
  fStack_64 = origin.y;
  pVVar3[iVar9].position.x = local_68;
  pVVar3[iVar9].position.y = fStack_64;
  pVVar3[iVar9].colour = colour;
  local_58 = top_left_texcoord.x;
  fStack_54 = top_left_texcoord.y;
  pVVar3[iVar9].tex_coord.x = local_58;
  pVVar3[iVar9].tex_coord.y = fStack_54;
  local_48 = dimensions.x;
  fStack_44 = dimensions.y;
  iVar6 = iVar9 + 1;
  pVVar3[iVar6].position.x = local_48 + local_68;
  pVVar3[iVar6].position.y = fStack_64;
  pVVar3[iVar6].colour = colour;
  local_38 = bottom_right_texcoord.x;
  fStack_34 = bottom_right_texcoord.y;
  pVVar3[iVar6].tex_coord.x = local_38;
  pVVar3[iVar6].tex_coord.y = fStack_54;
  iVar7 = iVar9 + 2;
  VVar5.y = fStack_44 + fStack_64;
  VVar5.x = local_48 + local_68;
  pVVar3[iVar7].position = VVar5;
  pVVar3[iVar7].colour = colour;
  pVVar3[iVar7].tex_coord.x = local_38;
  pVVar3[iVar7].tex_coord.y = fStack_34;
  iVar8 = iVar9 + 3;
  pVVar3[iVar8].position.x = local_68;
  pVVar3[iVar8].position.y = fStack_44 + fStack_64;
  pVVar3[iVar8].colour = colour;
  pVVar3[iVar8].tex_coord.x = local_58;
  pVVar3[iVar8].tex_coord.y = fStack_34;
  lVar10 = ((long)piVar1 - (long)piVar2) * 0x40000000;
  *(int *)((long)piVar4 + (lVar10 >> 0x1e)) = iVar9;
  *(int *)((long)piVar4 + (lVar10 + 0x100000000 >> 0x1e)) = iVar8;
  *(int *)((long)piVar4 + (lVar10 + 0x200000000 >> 0x1e)) = iVar6;
  *(int *)((long)piVar4 + (lVar10 + 0x300000000 >> 0x1e)) = iVar6;
  *(int *)((long)piVar4 + (lVar10 + 0x400000000 >> 0x1e)) = iVar8;
  *(int *)((long)piVar4 + (lVar10 + 0x500000000 >> 0x1e)) = iVar7;
  return;
}

Assistant:

void MeshUtilities::GenerateQuad(Mesh& mesh, Vector2f origin, Vector2f dimensions, ColourbPremultiplied colour, Vector2f top_left_texcoord,
	Vector2f bottom_right_texcoord)
{
	const int v0 = (int)mesh.vertices.size();
	const int i0 = (int)mesh.indices.size();

	mesh.vertices.resize(mesh.vertices.size() + 4);
	mesh.indices.resize(mesh.indices.size() + 6);
	Vertex* vertices = mesh.vertices.data();
	int* indices = mesh.indices.data();

	vertices[v0 + 0].position = origin;
	vertices[v0 + 0].colour = colour;
	vertices[v0 + 0].tex_coord = top_left_texcoord;

	vertices[v0 + 1].position = Vector2f(origin.x + dimensions.x, origin.y);
	vertices[v0 + 1].colour = colour;
	vertices[v0 + 1].tex_coord = Vector2f(bottom_right_texcoord.x, top_left_texcoord.y);

	vertices[v0 + 2].position = origin + dimensions;
	vertices[v0 + 2].colour = colour;
	vertices[v0 + 2].tex_coord = bottom_right_texcoord;

	vertices[v0 + 3].position = Vector2f(origin.x, origin.y + dimensions.y);
	vertices[v0 + 3].colour = colour;
	vertices[v0 + 3].tex_coord = Vector2f(top_left_texcoord.x, bottom_right_texcoord.y);

	indices[i0 + 0] = v0 + 0;
	indices[i0 + 1] = v0 + 3;
	indices[i0 + 2] = v0 + 1;

	indices[i0 + 3] = v0 + 1;
	indices[i0 + 4] = v0 + 3;
	indices[i0 + 5] = v0 + 2;
}